

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

wchar_t monster_critical(random_value dice,wchar_t rlev,wchar_t dam)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  uint local_28;
  wchar_t total;
  wchar_t max;
  wchar_t dam_local;
  wchar_t rlev_local;
  random_value dice_local;
  
  wVar1 = randcalc(dice,rlev,MAXIMISE);
  if (dam < (wVar1 * 0x13) / 0x14) {
    dice_local.sides = 0;
  }
  else if ((dam < L'\x14') && (wVar2 = Rand_div(100), dam <= wVar2)) {
    dice_local.sides = 0;
  }
  else {
    local_28 = (uint)(dam == wVar1);
    if (L'\x13' < dam) {
      while (uVar3 = Rand_div(100), (int)uVar3 < 2) {
        local_28 = local_28 + 1;
      }
    }
    if (dam < L'.') {
      if (dam < L'\"') {
        if (dam < L'\x1a') {
          if (dam < L'\x13') {
            if (dam < L'\f') {
              dice_local.sides = local_28 + 1;
            }
            else {
              dice_local.sides = local_28 + 2;
            }
          }
          else {
            dice_local.sides = local_28 + 3;
          }
        }
        else {
          dice_local.sides = local_28 + 4;
        }
      }
      else {
        dice_local.sides = local_28 + 5;
      }
    }
    else {
      dice_local.sides = local_28 + 6;
    }
  }
  return dice_local.sides;
}

Assistant:

static int monster_critical(random_value dice, int rlev, int dam)
{
	int max = 0;
	int total = randcalc(dice, rlev, MAXIMISE);

	/* Must do at least 95% of perfect */
	if (dam < total * 19 / 20) return (0);

	/* Weak blows rarely work */
	if ((dam < 20) && (randint0(100) >= dam)) return (0);

	/* Perfect damage */
	if (dam == total) max++;

	/* Super-charge */
	if (dam >= 20)
		while (randint0(100) < 2) max++;

	/* Critical damage */
	if (dam > 45) return (6 + max);
	if (dam > 33) return (5 + max);
	if (dam > 25) return (4 + max);
	if (dam > 18) return (3 + max);
	if (dam > 11) return (2 + max);
	return (1 + max);
}